

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall cnn::Parameters::Parameters(Parameters *this,Dim *d,float scale)

{
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *pvVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float *pfVar10;
  ulong uVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  int iVar21;
  undefined1 auVar22 [16];
  
  (this->super_ParametersBase)._vptr_ParametersBase = (_func_int **)&PTR_scale_parameters_003105d0;
  uVar4 = *(undefined8 *)(d->d + 2);
  uVar7 = *(undefined8 *)(d->d + 4);
  uVar8 = *(undefined8 *)(d->d + 6);
  *(undefined8 *)(this->dim).d = *(undefined8 *)d->d;
  *(undefined8 *)((this->dim).d + 2) = uVar4;
  *(undefined8 *)((this->dim).d + 4) = uVar7;
  *(undefined8 *)((this->dim).d + 6) = uVar8;
  (this->dim).bd = d->bd;
  (this->values).d.nd = 0;
  (this->values).d.bd = 1;
  (this->values).bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar22 = ZEXT816(0) << 0x20;
  pvVar1 = &(this->values).bs;
  (pvVar1->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar22._0_8_;
  (pvVar1->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar22._8_8_;
  (this->g).d.nd = 0;
  (this->g).d.bd = 1;
  (this->g).bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = &(this->g).bs;
  (pvVar1->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar22._0_8_;
  (pvVar1->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar22._8_8_;
  uVar4 = *(undefined8 *)(d->d + 2);
  uVar7 = *(undefined8 *)(d->d + 4);
  uVar8 = *(undefined8 *)(d->d + 6);
  *(undefined8 *)(this->g).d.d = *(undefined8 *)d->d;
  *(undefined8 *)((this->g).d.d + 2) = uVar4;
  *(undefined8 *)((this->g).d.d + 4) = uVar7;
  *(undefined8 *)((this->g).d.d + 6) = uVar8;
  (this->g).d.bd = d->bd;
  uVar4 = *(undefined8 *)d->d;
  uVar7 = *(undefined8 *)(d->d + 2);
  uVar8 = *(undefined8 *)(d->d + 4);
  uVar9 = *(undefined8 *)(d->d + 6);
  (this->values).d.bd = d->bd;
  *(undefined8 *)(this->values).d.d = uVar4;
  *(undefined8 *)((this->values).d.d + 2) = uVar7;
  *(undefined8 *)((this->values).d.d + 4) = uVar8;
  *(undefined8 *)((this->values).d.d + 6) = uVar9;
  if ((ulong)d->nd == 0) {
    iVar21 = 1;
  }
  else {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar11 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar4 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar6 = (byte)uVar4;
      uVar12 = CONCAT11(bVar6,bVar5);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])(d->d + uVar11));
      auVar19._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar19._0_4_ = (uint)(bVar5 & 1) * auVar15._0_4_;
      auVar19._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar19._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar19._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar19._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar19._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar19._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar19._32_4_ = (uint)(bVar6 & 1) * auVar15._32_4_;
      auVar19._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar15._36_4_;
      auVar19._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar15._40_4_;
      auVar19._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar15._44_4_;
      auVar19._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar15._48_4_;
      auVar19._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar15._52_4_;
      auVar19._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar15._56_4_;
      auVar19._60_4_ = (uint)(bVar6 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar19,auVar18);
      uVar11 = uVar11 + 0x10;
    } while (((ulong)d->nd + 0xf & 0x1fffffff0) != uVar11);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar15._0_4_ = (uint)(bVar5 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar15._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar6 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar6 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar6 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar6 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar6 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar6 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar15._60_4_ =
         (uint)(bVar6 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vpmulld_avx512f(auVar15,ZEXT3264(auVar13));
    auVar22 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar3 = vpshufd_avx(auVar22,0xee);
    auVar22 = vpmulld_avx(auVar22,auVar3);
    auVar3 = vpshufd_avx(auVar22,0x55);
    auVar22 = vpmulld_avx(auVar22,auVar3);
    iVar21 = auVar22._0_4_;
  }
  pfVar10 = (float *)AlignedMemoryPool::allocate(ps,(ulong)(iVar21 * d->bd) << 2);
  (this->values).v = pfVar10;
  if (scale == 0.0) {
    TensorTools::Randomize(&this->values);
  }
  else {
    TensorTools::Randomize(&this->values,scale);
  }
  if ((ulong)d->nd == 0) {
    iVar21 = 1;
  }
  else {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar11 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar4 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar6 = (byte)uVar4;
      uVar12 = CONCAT11(bVar6,bVar5);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])(d->d + uVar11));
      auVar20._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar20._0_4_ = (uint)(bVar5 & 1) * auVar15._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar20._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar20._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar20._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar20._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar20._32_4_ = (uint)(bVar6 & 1) * auVar15._32_4_;
      auVar20._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar15._36_4_;
      auVar20._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar15._40_4_;
      auVar20._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar15._44_4_;
      auVar20._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar15._48_4_;
      auVar20._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar15._52_4_;
      auVar20._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar15._56_4_;
      auVar20._60_4_ = (uint)(bVar6 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar20,auVar18);
      uVar11 = uVar11 + 0x10;
    } while (((ulong)d->nd + 0xf & 0x1fffffff0) != uVar11);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar16._0_4_ = (uint)(bVar5 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar16._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar16._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar16._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar16._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar16._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar6 >> 1 & 1);
    auVar16._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar6 >> 2 & 1);
    auVar16._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar6 >> 3 & 1);
    auVar16._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar6 >> 4 & 1);
    auVar16._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar6 >> 5 & 1);
    auVar16._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar6 >> 6 & 1);
    auVar16._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar16._60_4_ =
         (uint)(bVar6 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar16,1);
    auVar14 = vpmulld_avx512f(auVar16,ZEXT3264(auVar13));
    auVar22 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar3 = vpshufd_avx(auVar22,0xee);
    auVar22 = vpmulld_avx(auVar22,auVar3);
    auVar3 = vpshufd_avx(auVar22,0x55);
    auVar22 = vpmulld_avx(auVar22,auVar3);
    iVar21 = auVar22._0_4_;
  }
  pfVar10 = (float *)AlignedMemoryPool::allocate(ps,(ulong)(iVar21 * d->bd) << 2);
  (this->g).v = pfVar10;
  TensorTools::Zero(&this->g);
  return;
}

Assistant:

Parameters::Parameters(const Dim& d, float scale) : dim(d) {
  values.d = g.d = d;
  values.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
  if (scale) {
    TensorTools::Randomize(values, scale);
  }
  else {
    TensorTools::Randomize(values);
  }
  g.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
  TensorTools::Zero(g);
}